

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPValueIteration.cpp
# Opt level: O0

void __thiscall MDPValueIteration::SetQTable(MDPValueIteration *this,QTable *Q,Index time_step)

{
  uint in_EDX;
  QTable *in_RSI;
  long in_RDI;
  QTable *in_stack_ffffffffffffffd8;
  
  std::vector<QTable,_std::allocator<QTable>_>::operator[]
            ((vector<QTable,_std::allocator<QTable>_> *)(in_RDI + 0x20),(ulong)in_EDX);
  QTable::operator=(in_RSI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void MDPValueIteration::SetQTable(const QTable &Q, Index time_step)
{
    _m_QValues[time_step]=Q;
}